

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# betti.h
# Opt level: O0

void __thiscall
betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::betti_number(betti_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
               *this,size_t _betti,size_t _skipped)

{
  reference pvVar1;
  int iVar2;
  size_type in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  value_type_conflict3 *__x;
  int iVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar4;
  
  __x = (value_type_conflict3 *)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (in_RSI,in_RDX,(value_type_conflict3 *)0x0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(in_RSI,in_RDX,__x);
  pvVar4 = in_RSI;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x218),
                      (ulong)*(ushort *)(in_RDI + 0x210));
  iVar3 = (int)pvVar4;
  *pvVar1 = (value_type)in_RSI;
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x230),
                      (ulong)*(ushort *)(in_RDI + 0x210));
  *pvVar1 = in_RDX;
  iVar2 = 1;
  if ((*(ushort *)(in_RDI + 0x210) & 1) != 0) {
    iVar2 = -1;
  }
  *(int *)(in_RDI + 0x248) = iVar2 * iVar3 + *(int *)(in_RDI + 0x248);
  return;
}

Assistant:

virtual void betti_number(size_t _betti, size_t _skipped) override {
		betti.resize(current_dimension + 1, 0);
		skipped.resize(current_dimension + 1, 0);
		betti[current_dimension] = _betti;
		skipped[current_dimension] = _skipped;
		euler_characteristic += index_t((current_dimension & 1 ? -1 : 1) * _betti);
	}